

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool Dir2Div(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Node *pNVar1;
  Dict *pDVar2;
  tmbstr ptVar3;
  Node *child;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_DIR)) &&
     ((((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_UL)) &&
      (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_OL)))))) {
    doc_local._4_4_ = no;
  }
  else {
    pNVar1 = node->content;
    if (pNVar1 == (Node *)0x0) {
      doc_local._4_4_ = no;
    }
    else if (pNVar1->next == (Node *)0x0) {
      if (((pNVar1 == (Node *)0x0) || (pNVar1->tag == (Dict *)0x0)) ||
         (pNVar1->tag->id != TidyTag_LI)) {
        doc_local._4_4_ = no;
      }
      else if (pNVar1->implicit == no) {
        doc_local._4_4_ = no;
      }
      else {
        pDVar2 = prvTidyLookupTagDef(TidyTag_DIV);
        node->tag = pDVar2;
        (*doc->allocator->vtbl->free)(doc->allocator,node->element);
        ptVar3 = prvTidytmbstrdup(doc->allocator,"div");
        node->element = ptVar3;
        prvTidyAddStyleProperty(doc,node,"margin-left: 2em");
        StripOnlyChild(doc,node);
        doc_local._4_4_ = yes;
      }
    }
    else {
      doc_local._4_4_ = no;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool Dir2Div( TidyDocImpl* doc, Node *node, Node **ARG_UNUSED(pnode))
{
    Node *child;

    if ( nodeIsDIR(node) || nodeIsUL(node) || nodeIsOL(node) )
    {
        child = node->content;

        if (child == NULL)
            return no;

        /* check child has no peers */

        if (child->next)
            return no;

        if ( !nodeIsLI(child) )
            return no;

        if ( !child->implicit )
            return no;

        /* coerce dir to div */
        node->tag = TY_(LookupTagDef)( TidyTag_DIV );
        TidyDocFree( doc, node->element );
        node->element = TY_(tmbstrdup)(doc->allocator, "div");
        TY_(AddStyleProperty)( doc, node, "margin-left: 2em" );
        StripOnlyChild( doc, node );
        return yes;
    }

    return no;
}